

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
glu::getExtensions_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,glu *this,Functions *gl,ApiType apiType)

{
  deUint32 dVar1;
  char *__s;
  long lVar2;
  TestError *pTVar3;
  undefined4 in_register_0000000c;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  allocator<char> local_59;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  int numExtensions;
  
  uVar4 = (uint)gl & 0x30f;
  if (uVar4 == 2) {
    if (*(code **)(this + 0xa78) == (code *)0x0) {
      pTVar3 = (TestError *)
               __cxa_allocate_exception(0x38,this,2,CONCAT44(in_register_0000000c,apiType.m_bits));
      tcu::TestError::TestError
                (pTVar3,(char *)0x0,"gl.getString",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                 ,0xbf);
    }
    else {
      __s = (char *)(**(code **)(this + 0xa78))(0x1f03);
      dVar1 = (**(code **)(this + 0x800))();
      checkError(dVar1,"glGetString(GL_EXTENSIONS)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                 ,0xc2);
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&numExtensions,__s,&local_59);
        de::splitString(__return_storage_ptr__,(string *)&numExtensions,'\0');
        std::__cxx11::string::~string((string *)&numExtensions);
        return __return_storage_ptr__;
      }
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"glGetString(GL_EXTENSIONS) returned null pointer",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                 ,199);
    }
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  numExtensions = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = __return_storage_ptr__;
  if ((*(code **)(this + 0x868) != (code *)0x0) && (*(long *)(this + 0xa80) != 0)) {
    (**(code **)(this + 0x868))(0x821d,&numExtensions);
    dVar1 = (**(code **)(this + 0x800))();
    checkError(dVar1,"glGetIntegerv(GL_NUM_EXTENSIONS)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
               ,0xd1);
    if (0 < (long)numExtensions) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(local_58,(long)numExtensions);
      lVar5 = 0;
      for (uVar6 = 0; (long)uVar6 < (long)numExtensions; uVar6 = uVar6 + 1) {
        lVar2 = (**(code **)(this + 0xa80))(0x1f03,uVar6 & 0xffffffff);
        dVar1 = (**(code **)(this + 0x800))();
        checkError(dVar1,"glGetStringi(GL_EXTENSIONS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                   ,0xda);
        if (lVar2 == 0) {
          pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar3,"glGetStringi(GL_EXTENSIONS) returned null pointer",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                     ,0xdf);
          __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        std::__cxx11::string::assign
                  ((char *)((long)&(((local_58->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar5));
        lVar5 = lVar5 + 0x20;
      }
    }
    return local_58;
  }
  pTVar3 = (TestError *)
           __cxa_allocate_exception(0x38,this,uVar4,CONCAT44(in_register_0000000c,apiType.m_bits));
  tcu::TestError::TestError
            (pTVar3,(char *)0x0,"gl.getIntegerv && gl.getStringi",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
             ,0xce);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static std::vector<std::string> getExtensions (const glw::Functions& gl, ApiType apiType)
{
	using std::vector;
	using std::string;

	if (apiType.getProfile() == PROFILE_ES && apiType.getMajorVersion() == 2)
	{
		TCU_CHECK(gl.getString);

		const char*	extStr	= (const char*)gl.getString(GL_EXTENSIONS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetString(GL_EXTENSIONS)");

		if (extStr)
			return de::splitString(extStr);
		else
			throw tcu::TestError("glGetString(GL_EXTENSIONS) returned null pointer", DE_NULL, __FILE__, __LINE__);
	}
	else
	{
		int				numExtensions	= 0;
		vector<string>	extensions;

		TCU_CHECK(gl.getIntegerv && gl.getStringi);

		gl.getIntegerv(GL_NUM_EXTENSIONS, &numExtensions);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_NUM_EXTENSIONS)");

		if (numExtensions > 0)
		{
			extensions.resize(numExtensions);

			for (int ndx = 0; ndx < numExtensions; ndx++)
			{
				const char* const ext = (const char*)gl.getStringi(GL_EXTENSIONS, ndx);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetStringi(GL_EXTENSIONS)");

				if (ext)
					extensions[ndx] = ext;
				else
					throw tcu::TestError("glGetStringi(GL_EXTENSIONS) returned null pointer", DE_NULL, __FILE__, __LINE__);
			}

		}

		return extensions;
	}
}